

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_query.cpp
# Opt level: O3

void __thiscall create::SerialQuery::processByte(SerialQuery *this,uint8_t byteRead)

{
  byte bVar1;
  undefined7 in_register_00000031;
  Packet *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar1 = this->packetByte;
  this->packetData =
       this->packetData |
       (ushort)((int)CONCAT71(in_register_00000031,byteRead) << ((bVar1 & 3) << 3));
  if ((char)bVar1 < '\x01') {
    if (this->maxPacketID <= this->packetID) {
      this->packetID = '\a';
      this->packetByte = '\0';
      this->packetData = 0;
      Serial::notifyDataReady(&this->super_Serial);
      requestSensorData(this);
      return;
    }
    Data::getPacket((Data *)&local_28,
                    (uint8_t)(this->super_Serial).data.
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Packet::setDataToValidate(local_28,&this->packetData);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    this->packetData = 0;
    this->packetID = this->packetID + '\x01';
    Data::getPacket((Data *)&local_28,
                    (uint8_t)(this->super_Serial).data.
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    this->packetByte = local_28->nbytes + 0xff;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  else {
    this->packetByte = bVar1 - 1;
  }
  return;
}

Assistant:

void SerialQuery::processByte(uint8_t byteRead) {
    packetData |= (static_cast<uint16_t>(byteRead) << (8 * packetByte));

    if (packetByte > 0) {
      --packetByte;
    } else if (packetID < maxPacketID) {
      // New packet
      data->getPacket(packetID)->setDataToValidate(packetData);
      packetData = 0;
      ++packetID;
      packetByte = data->getPacket(packetID)->nbytes - 1;
    } else {
      // Response finished
      packetID = ID_BUMP_WHEELDROP;
      packetByte = 0;
      packetData = 0;
      notifyDataReady();
      requestSensorData();
    }
  }